

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# launch.c
# Opt level: O0

void authenticate_and_launch(void)

{
  int iVar1;
  char local_15 [8];
  char response [8];
  _Bool allowaccess;
  int n_missiles;
  
  response[1] = '\x02';
  response[2] = '\0';
  response[3] = '\0';
  response[4] = '\0';
  response[0] = '\0';
  printf("Secret: ");
  gets(local_15);
  iVar1 = strcmp(local_15,"Joshua");
  if (iVar1 == 0) {
    response[0] = '\x01';
  }
  if ((response[0] & 1U) != 0) {
    puts("Access granted");
    launch_missiles(response._1_4_);
  }
  if ((response[0] & 1U) == 0) {
    puts("Access denied");
  }
  return;
}

Assistant:

void authenticate_and_launch(void) {
  int n_missiles = 2;
  bool allowaccess = false;
  char response[8];

  printf("Secret: ");
  gets(response);

  if (strcmp(response, "Joshua") == 0)
    allowaccess = true;

  if (allowaccess) {
    puts("Access granted");
    launch_missiles(n_missiles);
  }

  if (!allowaccess)
    puts("Access denied");
}